

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::SerializePartialToZeroCopyStream
          (MessageLite *this,ZeroCopyOutputStream *output)

{
  byte bVar1;
  int iVar2;
  undefined4 extraout_var;
  LogMessage *pLVar3;
  undefined4 extraout_var_00;
  LogFinisher local_79;
  string local_78;
  EpsCopyOutputStream stream;
  
  iVar2 = (*this->_vptr_MessageLite[9])();
  if ((CONCAT44(extraout_var,iVar2) & 0xffffffff80000000) == 0) {
    stream.end_ = stream.buffer_;
    stream.had_error_ = false;
    stream.aliasing_enabled_ = false;
    stream.is_serialization_deterministic_ =
         (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
    stream.buffer_end_ = stream.end_;
    stream.stream_ = output;
    iVar2 = (*this->_vptr_MessageLite[0xc])(this,stream.end_,&stream);
    io::EpsCopyOutputStream::Trim(&stream,(uint8 *)CONCAT44(extraout_var_00,iVar2));
    bVar1 = stream.had_error_ ^ 1;
  }
  else {
    internal::LogMessage::LogMessage
              ((LogMessage *)&stream,LOGLEVEL_DFATAL,
               "third_party/sentencepiece/third_party/protobuf-lite/message_lite.cc",0x19a);
    (*this->_vptr_MessageLite[2])(&local_78,this);
    pLVar3 = internal::LogMessage::operator<<((LogMessage *)&stream,&local_78);
    pLVar3 = internal::LogMessage::operator<<(pLVar3," exceeded maximum protobuf size of 2GB: ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,CONCAT44(extraout_var,iVar2));
    internal::LogFinisher::operator=(&local_79,pLVar3);
    std::__cxx11::string::~string((string *)&local_78);
    internal::LogMessage::~LogMessage((LogMessage *)&stream);
    bVar1 = 0;
  }
  return (bool)bVar1;
}

Assistant:

bool MessageLite::SerializePartialToZeroCopyStream(
    io::ZeroCopyOutputStream* output) const {
  const size_t size = ByteSizeLong();  // Force size to be cached.
  if (size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << size;
    return false;
  }

  uint8* target;
  io::EpsCopyOutputStream stream(
      output, io::CodedOutputStream::IsDefaultSerializationDeterministic(),
      &target);
  target = _InternalSerialize(target, &stream);
  stream.Trim(target);
  if (stream.HadError()) return false;
  return true;
}